

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_writer.cpp
# Opt level: O2

void __thiscall duckdb::ParquetWriter::FlushRowGroup(ParquetWriter *this,PreparedRowGroup *prepared)

{
  vector<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>,_true>
  *this_00;
  int64_t *piVar1;
  idx_t offset;
  pointer pBVar2;
  idx_t iVar3;
  long lVar4;
  reference this_01;
  reference pvVar5;
  pointer pCVar6;
  type pCVar7;
  const_reference pvVar8;
  unsigned_long params_2;
  unsigned_long uVar9;
  IOException *pIVar10;
  InternalException *this_02;
  ulong uVar11;
  allocator local_a1;
  ParquetWriter *local_a0;
  string *local_98;
  idx_t local_90;
  string local_88;
  pthread_mutex_t *local_68;
  unique_ptr<duckdb::BufferedFileWriter,_std::default_delete<duckdb::BufferedFileWriter>,_true>
  *local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  vector<duckdb_parquet::ColumnChunk,_true> *local_38;
  
  local_68 = (pthread_mutex_t *)&this->lock;
  ::std::mutex::lock((mutex *)&local_68->__data);
  if ((prepared->states).
      super_vector<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (prepared->states).
      super_vector<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    this_02 = (InternalException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&local_88,"Attempting to flush a row group with no rows",
               (allocator *)&local_58);
    InternalException::InternalException(this_02,&local_88);
    __cxa_throw(this_02,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  local_60 = &this->writer;
  local_a0 = this;
  pBVar2 = unique_ptr<duckdb::BufferedFileWriter,_std::default_delete<duckdb::BufferedFileWriter>,_true>
           ::operator->(local_60);
  iVar3 = BufferedFileWriter::GetTotalWritten(pBVar2);
  lVar4 = NumericCastImpl<long,_unsigned_long,_false>::Convert(iVar3);
  (prepared->row_group).file_offset = lVar4;
  this_00 = &local_a0->column_writers;
  for (uVar11 = 0;
      uVar11 < (ulong)((long)(prepared->states).
                             super_vector<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>_>_>
                             .
                             super__Vector_base<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(prepared->states).
                             super_vector<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>_>_>
                             .
                             super__Vector_base<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 3); uVar11 = uVar11 + 1) {
    this_01 = vector<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>,_true>
              ::get<true>(this_00,uVar11);
    pvVar5 = vector<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_true>
             ::get<true>(&prepared->states,uVar11);
    local_88._M_dataplus._M_p =
         (pointer)(pvVar5->
                  super_unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>_>
                  )._M_t.
                  super___uniq_ptr_impl<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_duckdb::ColumnWriterState_*,_std::default_delete<duckdb::ColumnWriterState>_>
                  .super__Head_base<0UL,_duckdb::ColumnWriterState_*,_false>._M_head_impl;
    (pvVar5->
    super_unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>_>).
    _M_t.
    super___uniq_ptr_impl<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::ColumnWriterState_*,_std::default_delete<duckdb::ColumnWriterState>_>
    .super__Head_base<0UL,_duckdb::ColumnWriterState_*,_false>._M_head_impl =
         (ColumnWriterState *)0x0;
    pCVar6 = unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>::
             operator->(this_01);
    pCVar7 = unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>
             ::operator*((unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>
                          *)&local_88);
    (*pCVar6->_vptr_ColumnWriter[9])(pCVar6,pCVar7);
    if ((ColumnWriterState *)local_88._M_dataplus._M_p != (ColumnWriterState *)0x0) {
      (**(code **)(*(long *)local_88._M_dataplus._M_p + 8))();
    }
  }
  pBVar2 = unique_ptr<duckdb::BufferedFileWriter,_std::default_delete<duckdb::BufferedFileWriter>,_true>
           ::operator->(local_60);
  iVar3 = BufferedFileWriter::GetTotalWritten(pBVar2);
  local_98 = &local_a0->file_name;
  local_38 = &(prepared->row_group).columns;
  uVar11 = 0;
  local_90 = iVar3;
  while( true ) {
    if ((ulong)(((long)(prepared->row_group).columns.
                       super_vector<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>
                       .
                       super__Vector_base<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)(prepared->row_group).columns.
                      super_vector<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>
                      .
                      super__Vector_base<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>
                      ._M_impl.super__Vector_impl_data._M_start) / 0x280) <= uVar11) {
      ::std::vector<duckdb_parquet::RowGroup,_std::allocator<duckdb_parquet::RowGroup>_>::push_back
                (&(local_a0->file_meta_data).row_groups.
                  super_vector<duckdb_parquet::RowGroup,_std::allocator<duckdb_parquet::RowGroup>_>,
                 &prepared->row_group);
      piVar1 = &(local_a0->file_meta_data).num_rows;
      *piVar1 = *piVar1 + (prepared->row_group).num_rows;
      pBVar2 = unique_ptr<duckdb::BufferedFileWriter,_std::default_delete<duckdb::BufferedFileWriter>,_true>
               ::operator->(local_60);
      iVar3 = BufferedFileWriter::GetTotalWritten(pBVar2);
      LOCK();
      (local_a0->total_written).super___atomic_base<unsigned_long>._M_i = iVar3;
      UNLOCK();
      LOCK();
      (local_a0->num_row_groups).super___atomic_base<unsigned_long>._M_i =
           (local_a0->num_row_groups).super___atomic_base<unsigned_long>._M_i + 1;
      UNLOCK();
      pthread_mutex_unlock(local_68);
      return;
    }
    pvVar8 = vector<duckdb_parquet::ColumnChunk,_true>::get<true>(local_38,uVar11);
    offset = (pvVar8->meta_data).data_page_offset;
    ::std::__cxx11::string::string((string *)&local_88,"data page offset",(allocator *)&local_58);
    ValidateOffsetInFile(local_98,uVar11,iVar3,offset,&local_88);
    ::std::__cxx11::string::~string((string *)&local_88);
    params_2 = NumericCastImpl<unsigned_long,_long,_false>::Convert
                         ((pvVar8->meta_data).data_page_offset);
    if (((byte)(pvVar8->meta_data).__isset & 4) != 0) {
      iVar3 = (pvVar8->meta_data).dictionary_page_offset;
      ::std::__cxx11::string::string
                ((string *)&local_88,"dictionary page offset",(allocator *)&local_58);
      ValidateOffsetInFile(local_98,uVar11,local_90,iVar3,&local_88);
      ::std::__cxx11::string::~string((string *)&local_88);
      uVar9 = NumericCastImpl<unsigned_long,_long,_false>::Convert
                        ((pvVar8->meta_data).dictionary_page_offset);
      if (params_2 <= uVar9) {
        pIVar10 = (IOException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&local_88,
                   "Parquet file \'%s\': metadata is corrupt. Dictionary page (offset=%llu) must come before any data pages (offset=%llu)."
                   ,&local_a1);
        ::std::__cxx11::string::string((string *)&local_58,(string *)local_98);
        IOException::IOException<std::__cxx11::string,long,unsigned_long>
                  (pIVar10,&local_88,&local_58,(pvVar8->meta_data).dictionary_page_offset,params_2);
        __cxa_throw(pIVar10,&IOException::typeinfo,::std::runtime_error::~runtime_error);
      }
      params_2 = (pvVar8->meta_data).dictionary_page_offset;
      iVar3 = local_90;
    }
    uVar9 = NumericCastImpl<unsigned_long,_long,_false>::Convert
                      ((pvVar8->meta_data).total_compressed_size);
    if (iVar3 <= (uVar9 + params_2) - 1) break;
    uVar11 = uVar11 + 1;
  }
  pIVar10 = (IOException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_88,
             "Parquet file \'%s\': metadata is corrupt. Column %llu has invalid column offsets (offset=%llu, size=%llu, file_size=%llu)."
             ,&local_a1);
  ::std::__cxx11::string::string((string *)&local_58,(string *)local_98);
  IOException::
  IOException<std::__cxx11::string,unsigned_long,unsigned_long,unsigned_long,unsigned_long>
            (pIVar10,&local_88,&local_58,uVar11,params_2,uVar9,local_90);
  __cxa_throw(pIVar10,&IOException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void ParquetWriter::FlushRowGroup(PreparedRowGroup &prepared) {
	lock_guard<mutex> glock(lock);
	auto &row_group = prepared.row_group;
	auto &states = prepared.states;
	if (states.empty()) {
		throw InternalException("Attempting to flush a row group with no rows");
	}
	row_group.file_offset = NumericCast<int64_t>(writer->GetTotalWritten());
	for (idx_t col_idx = 0; col_idx < states.size(); col_idx++) {
		const auto &col_writer = column_writers[col_idx];
		auto write_state = std::move(states[col_idx]);
		col_writer->FinalizeWrite(*write_state);
	}
	// let's make sure all offsets are ay-okay
	ValidateColumnOffsets(file_name, writer->GetTotalWritten(), row_group);

	// append the row group to the file meta data
	file_meta_data.row_groups.push_back(row_group);
	file_meta_data.num_rows += row_group.num_rows;

	total_written = writer->GetTotalWritten();
	num_row_groups++;
}